

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O1

int Abc_TruthNpnCountUnique(Abc_TtStore_t *p)

{
  size_t __size;
  uint uVar1;
  word **ppwVar2;
  word *pwVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *__s;
  void *__s_00;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  undefined4 *puVar13;
  long lVar14;
  
  uVar1 = p->nFuncs;
  uVar7 = uVar1 - 1;
  while( true ) {
    do {
      uVar8 = uVar7 + 1;
      uVar4 = uVar7 & 1;
      uVar7 = uVar8;
    } while (uVar4 != 0);
    if (uVar8 < 9) break;
    iVar11 = 5;
    while (uVar8 % (iVar11 - 2U) != 0) {
      uVar4 = iVar11 * iVar11;
      iVar11 = iVar11 + 2;
      if (uVar8 < uVar4) goto LAB_002d9dd1;
    }
  }
LAB_002d9dd1:
  __size = (long)(int)uVar8 * 4;
  __s = malloc(__size);
  memset(__s,0xff,__size);
  __s_00 = malloc(__size);
  memset(__s_00,0xff,__size);
  if (0 < (int)uVar1) {
    uVar7 = p->nWords;
    uVar10 = 0;
    do {
      ppwVar2 = p->pFuncs;
      if ((int)uVar7 < 1) {
        uVar9 = 0;
      }
      else {
        puVar13 = &Abc_TruthHashKey_s_BigPrimes;
        lVar14 = 0;
        uVar12 = 0;
        uVar9 = 0;
        do {
          uVar9 = uVar9 + (ulong)(uint)puVar13[(uVar12 / 7) * -7] *
                          *(long *)((long)ppwVar2[uVar10] + lVar14);
          uVar12 = uVar12 + 1;
          lVar14 = lVar14 + 8;
          puVar13 = puVar13 + 1;
        } while ((ulong)uVar7 << 3 != lVar14);
      }
      lVar14 = (long)(int)(uVar9 % (ulong)(long)(int)uVar8);
      iVar11 = *(int *)((long)__s + lVar14 * 4);
      if (iVar11 != -1) {
        pwVar3 = ppwVar2[uVar10];
        iVar5 = iVar11;
        do {
          iVar6 = bcmp(ppwVar2[iVar5],pwVar3,(long)(int)uVar7 << 3);
          if (iVar6 == 0) {
            ppwVar2[uVar10] = (word *)0x0;
            goto LAB_002d9f3a;
          }
          iVar5 = *(int *)((long)__s_00 + (long)iVar5 * 4);
        } while (iVar5 != -1);
      }
      *(int *)((long)__s_00 + uVar10 * 4) = iVar11;
      *(int *)((long)__s + lVar14 * 4) = (int)uVar10;
LAB_002d9f3a:
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar1);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  if (*p->pFuncs == (word *)0x0) {
    __assert_fail("p->pFuncs[0] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcNpn.c"
                  ,0x6d,"int Abc_TruthNpnCountUnique(Abc_TtStore_t *)");
  }
  iVar11 = 1;
  if (1 < (int)uVar1) {
    uVar10 = 1;
    do {
      pwVar3 = p->pFuncs[uVar10];
      if (pwVar3 != (word *)0x0) {
        lVar14 = (long)iVar11;
        iVar11 = iVar11 + 1;
        p->pFuncs[lVar14] = pwVar3;
      }
      uVar10 = uVar10 + 1;
    } while (uVar1 != uVar10);
  }
  p->nFuncs = iVar11;
  return iVar11;
}

Assistant:

int Abc_TruthNpnCountUnique( Abc_TtStore_t * p )
{
    // allocate hash table
    int nTableSize = Abc_PrimeCudd(p->nFuncs);
    int * pTable = ABC_FALLOC( int, nTableSize );
    int * pNexts = ABC_FALLOC( int, nTableSize );
    // hash functions
    int i, k, Key;
    for ( i = 0; i < p->nFuncs; i++ )
    {
        Key = Abc_TruthHashKey( p->pFuncs[i], p->nWords, nTableSize );
        if ( Abc_TruthHashLookup( p->pFuncs, i, p->nWords, pTable, pNexts, Key ) ) // found equal
            p->pFuncs[i] = NULL;
        else // there is no equal (the first time this one occurs so far)
            pNexts[i] = pTable[Key], pTable[Key] = i;
    }
    ABC_FREE( pTable );
    ABC_FREE( pNexts );
    // count the number of unqiue functions
    assert( p->pFuncs[0] != NULL );
    for ( i = k = 1; i < p->nFuncs; i++ )
        if ( p->pFuncs[i] != NULL )
            p->pFuncs[k++] = p->pFuncs[i];
    return (p->nFuncs = k);
}